

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O3

void close_window(WindowHandle *h_wnd)

{
  WindowHandleData *this;
  int iVar1;
  WindowHandle pWVar2;
  
  if (*h_wnd != (WindowHandle)0x0) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&(*h_wnd)->mt);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    pWVar2 = *h_wnd;
    if (pWVar2->listener != (IWindowListener *)0x0) {
      (*(code *)**(undefined8 **)pWVar2->listener)();
      pWVar2 = *h_wnd;
    }
    LOCK();
    (pWVar2->quit)._M_base._M_i = true;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)&(*h_wnd)->mt);
    std::thread::join();
    this = *h_wnd;
    if (this != (WindowHandleData *)0x0) {
      WindowHandleData::~WindowHandleData(this);
    }
    operator_delete(this,0xd8);
    *h_wnd = (WindowHandle)0x0;
  }
  return;
}

Assistant:

void close_window(WindowHandle& h_wnd)
  {
  if (h_wnd)
    {
#ifdef _WIN32
    PostMessage(h_wnd->h_wnd, WM_CLOSE, NULL, NULL);
#else
    h_wnd->mt.lock();
    if (h_wnd->listener)
      h_wnd->listener->OnClose();    
    h_wnd->quit = true;
    h_wnd->mt.unlock();
#endif
    h_wnd->t->join();
    delete h_wnd;
    h_wnd = nullptr;
    }
  }